

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void compact_with_snapshot_open_multi_kvs_test(void)

{
  fdb_status fVar1;
  size_t sVar2;
  size_t sVar3;
  fdb_kvs_handle *pfVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  fdb_file_handle *fhandle;
  long lVar10;
  size_t unaff_R13;
  fdb_custom_cmp_variable p_Var11;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db5;
  fdb_kvs_handle *db4;
  fdb_kvs_handle *db3;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db1;
  cb_args cb_args;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  fdb_file_handle *pfStack_548;
  timeval tStack_540;
  fdb_config fStack_530;
  code *pcStack_438;
  fdb_kvs_handle *pfStack_430;
  fdb_kvs_handle *pfStack_428;
  ulong uStack_420;
  fdb_kvs_handle *pfStack_418;
  fdb_kvs_config fStack_410;
  timeval tStack_3f8;
  char *pcStack_3e8;
  char *pcStack_3e0;
  size_t sStack_3d8;
  char *pcStack_3d0;
  char *pcStack_3c8;
  code *pcStack_3c0;
  fdb_file_handle *local_3b0;
  int local_3a4;
  fdb_kvs_handle *local_3a0;
  fdb_kvs_handle *local_398;
  fdb_kvs_handle *local_390;
  fdb_kvs_handle *local_388;
  fdb_kvs_handle *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  timeval local_358;
  fdb_kvs_config local_348;
  fdb_config local_330;
  char local_238 [256];
  char local_138 [264];
  
  pcStack_3c0 = (code *)0x11346b;
  gettimeofday(&local_358,(__timezone_ptr_t)0x0);
  pcStack_3c0 = (code *)0x113470;
  memleak_start();
  pcStack_3c0 = (code *)0x113480;
  fdb_get_default_config();
  pcStack_3c0 = (code *)0x11348d;
  fdb_get_default_kvs_config();
  local_330.compaction_cb_ctx = &local_378;
  local_378 = 0;
  uStack_370 = 0;
  local_368 = 0;
  local_330.wal_threshold = 0x400;
  local_330.flags = 1;
  local_330.compaction_cb = compaction_cb_markers;
  local_330.compaction_cb_mask = 0x1b;
  pcStack_3c0 = (code *)0x1134d3;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_3c0 = (code *)0x1134ea;
  fdb_open(&local_3b0,"./compact_test1",&local_330);
  pcStack_3c0 = (code *)0x113501;
  fdb_kvs_open(local_3b0,&local_380,"db1",&local_348);
  pcStack_3c0 = (code *)0x113518;
  fdb_kvs_open(local_3b0,&local_388,"db2",&local_348);
  pcStack_3c0 = (code *)0x11352f;
  fdb_kvs_open(local_3b0,&local_390,"db3",&local_348);
  pcStack_3c0 = (code *)0x113546;
  fdb_kvs_open(local_3b0,&local_398,"db4",&local_348);
  pcStack_3c0 = (code *)0x11355d;
  fdb_kvs_open(local_3b0,&local_3a0,"db5",&local_348);
  uVar5 = 0;
  do {
    iVar6 = (int)uVar5;
    if (iVar6 == 5) goto LAB_001136e1;
    uVar5 = 0;
    local_3a4 = iVar6;
    do {
      pcStack_3c0 = (code *)0x11359b;
      sprintf(local_138,"key%04d",uVar5);
      pcStack_3c0 = (code *)0x1135aa;
      sprintf(local_238,"body%04d",uVar5);
      pfVar4 = local_380;
      pcStack_3c0 = (code *)0x1135b7;
      sVar2 = strlen(local_138);
      pcStack_3c0 = (code *)0x1135c5;
      sVar3 = strlen(local_238);
      pcStack_3c0 = (code *)0x1135d9;
      fdb_set_kv(pfVar4,local_138,sVar2,local_238,sVar3);
      pfVar4 = local_388;
      pcStack_3c0 = (code *)0x1135e6;
      sVar2 = strlen(local_138);
      pcStack_3c0 = (code *)0x1135f1;
      sVar3 = strlen(local_238);
      pcStack_3c0 = (code *)0x113605;
      fdb_set_kv(pfVar4,local_138,sVar2,local_238,sVar3);
      pfVar4 = local_390;
      pcStack_3c0 = (code *)0x113612;
      sVar2 = strlen(local_138);
      pcStack_3c0 = (code *)0x11361d;
      sVar3 = strlen(local_238);
      pcStack_3c0 = (code *)0x113631;
      fdb_set_kv(pfVar4,local_138,sVar2,local_238,sVar3);
      pfVar4 = local_398;
      pcStack_3c0 = (code *)0x11363e;
      sVar2 = strlen(local_138);
      pcStack_3c0 = (code *)0x113649;
      sVar3 = strlen(local_238);
      pcStack_3c0 = (code *)0x11365d;
      fdb_set_kv(pfVar4,local_138,sVar2,local_238,sVar3);
      pfVar4 = local_3a0;
      pcStack_3c0 = (code *)0x11366a;
      unaff_R13 = strlen(local_138);
      pcStack_3c0 = (code *)0x113675;
      sVar2 = strlen(local_238);
      pcStack_3c0 = (code *)0x113693;
      fdb_set_kv(pfVar4,local_138,unaff_R13,local_238,sVar2);
      uVar7 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar7;
    } while (uVar7 != 1000);
    pcStack_3c0 = (code *)0x1136b0;
    fhandle = local_3b0;
    fVar1 = fdb_commit(local_3b0,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_3c0 = (code *)0x113740;
      compact_with_snapshot_open_multi_kvs_test();
      goto LAB_00113740;
    }
    uVar5 = (ulong)(local_3a4 + 1U);
    local_378 = CONCAT44(local_378._4_4_,(local_3a4 + 1U) * 1000);
    pcStack_3c0 = (code *)0x1136d4;
    fVar1 = fdb_compact(local_3b0,(char *)0x0);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pcStack_3c0 = (code *)0x1136e1;
  compact_with_snapshot_open_multi_kvs_test();
LAB_001136e1:
  pcStack_3c0 = (code *)0x1136eb;
  fhandle = local_3b0;
  fVar1 = fdb_close(local_3b0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_3c0 = (code *)0x1136f4;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcVar9 = "%s PASSED\n";
      if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pcStack_3c0 = (code *)0x113729;
      fprintf(_stderr,pcVar9,"compact with snapshot_open multi kvs test");
      return;
    }
  }
  else {
LAB_00113740:
    pcStack_3c0 = (code *)0x113745;
    compact_with_snapshot_open_multi_kvs_test();
  }
  pcStack_3c0 = compaction_cb_markers;
  compact_with_snapshot_open_multi_kvs_test();
  pcStack_3c8 = "body%04d";
  pcStack_3e8 = "key%04d";
  pcStack_438 = (code *)0x11376f;
  pcStack_3e0 = local_238;
  sStack_3d8 = unaff_R13;
  pcStack_3d0 = local_138;
  pcStack_3c0 = (code *)uVar5;
  gettimeofday(&tStack_3f8,(__timezone_ptr_t)0x0);
  pcStack_438 = (code *)0x113779;
  fdb_get_default_kvs_config();
  iVar6 = *(int *)&local_3b0->root;
  pcStack_438 = (code *)0x11378c;
  fVar1 = fdb_get_all_snap_markers(fhandle,(fdb_snapshot_info_t **)&pfStack_430,&uStack_420);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfVar4 = pfStack_430;
    if ((pfStack_430->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x6) {
      pcStack_438 = (code *)0x113870;
      compaction_cb_markers();
      pfVar4 = pfStack_428;
    }
    if (*(fdb_seqnum_t *)((long)(pfVar4->kvs_config).custom_cmp_param + 8) == (long)iVar6) {
      if (uStack_420 != 0) {
        uVar8 = 0;
        uVar5 = uStack_420;
        do {
          if ((&pfVar4->kvs_config)[uVar8].custom_cmp != (fdb_custom_cmp_variable)0x0) {
            lVar10 = 0;
            p_Var11 = (fdb_custom_cmp_variable)0x0;
            do {
              pcVar9 = *(char **)((long)(&pfVar4->kvs_config)[uVar8].custom_cmp_param + lVar10);
              if (pcVar9 != (char *)0x0) {
                pcStack_438 = (code *)0x1137fa;
                fdb_kvs_open(fhandle,&pfStack_428,pcVar9,&fStack_410);
                pcStack_438 = (code *)0x11380c;
                fVar1 = fdb_snapshot_open(pfStack_428,&pfStack_418,(long)iVar6);
                if (fVar1 == FDB_RESULT_SUCCESS) {
                  pcStack_438 = (code *)0x11381a;
                  fVar1 = fdb_kvs_close(pfStack_418);
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    pcStack_438 = (code *)0x11387d;
                    compaction_cb_markers();
                    goto LAB_0011387d;
                  }
                  pcStack_438 = (code *)0x113828;
                  fVar1 = fdb_kvs_close(pfStack_428);
                  pfVar4 = pfStack_430;
                  if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113830;
                }
                else {
LAB_0011387d:
                  pcStack_438 = (code *)0x113882;
                  compaction_cb_markers();
                }
                pcStack_438 = (code *)0x113887;
                compaction_cb_markers();
                goto LAB_00113887;
              }
LAB_00113830:
              p_Var11 = p_Var11 + 1;
              lVar10 = lVar10 + 0x10;
              uVar5 = uStack_420;
            } while (p_Var11 < (&pfVar4->kvs_config)[uVar8].custom_cmp);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar5);
      }
      return;
    }
  }
  else {
LAB_00113887:
    pcStack_438 = (code *)0x11388c;
    compaction_cb_markers();
  }
  pcStack_438 = db_compact_during_compaction_cancellation;
  compaction_cb_markers();
  gettimeofday(&tStack_540,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fStack_530.compaction_cb = cb_cancel_test;
  fStack_530.compaction_cb_ctx = (void *)0x0;
  fStack_530.compaction_cb_mask = 0x11;
  fVar1 = fdb_open(&pfStack_548,"compact_test",&fStack_530);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcac);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
  }
  fVar1 = fdb_compact(pfStack_548,(char *)0x0);
  if (((uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
     ((0x200004000001U >> ((ulong)(uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
    fdb_close(pfStack_548);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0xcb1);
  __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
}

Assistant:

void compact_with_snapshot_open_multi_kvs_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, r;
    int n = 1000;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db1, *db2, *db3, *db4, *db5;
    fdb_status s;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    struct cb_args cb_args;

    memset(&cb_args, 0x0, sizeof(struct cb_args));

    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_cb = compaction_cb_markers;
    fconfig.compaction_cb_ctx = &cb_args;
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_MOVE_DOC |
                                 FDB_CS_FLUSH_WAL |
                                 FDB_CS_END;

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open two handles for kvs
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db1, "db1", &kvs_config);
    fdb_kvs_open(dbfile, &db2, "db2", &kvs_config);
    fdb_kvs_open(dbfile, &db3, "db3", &kvs_config);
    fdb_kvs_open(dbfile, &db4, "db4", &kvs_config);
    fdb_kvs_open(dbfile, &db5, "db5", &kvs_config);
    for (j=0;j<5;++j){
        for (i=0;i<n;++i){
            sprintf(keybuf, "key%04d", i);
            sprintf(bodybuf, "body%04d", i);
            fdb_set_kv(db1, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db2, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db3, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db4, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db5, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        }

        // commit
        s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // compact
        cb_args.n_moved_docs = n*(j+1);
        s = fdb_compact(dbfile, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_RESULT("compact with snapshot_open multi kvs test");
}